

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcsutil.c
# Opt level: O3

int ffwldp(double xpix,double ypix,double xref,double yref,double xrefpix,double yrefpix,double xinc
          ,double yinc,double rot,char *type,double *xpos,double *ypos,int *status)

{
  byte bVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double __x;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_f8;
  double local_d8;
  double dStack_d0;
  
  if (0 < *status) {
    return *status;
  }
  local_d8 = yinc * (ypix - yrefpix);
  dStack_d0 = xinc * (xpix - xrefpix);
  dVar6 = cos(rot * 0.01745329252);
  dVar7 = sin(rot * 0.01745329252);
  if ((rot != 0.0) || (NAN(rot))) {
    dVar19 = -local_d8;
    local_d8 = dVar6 * local_d8 + dVar7 * dStack_d0;
    dStack_d0 = dVar6 * dStack_d0 + dVar7 * dVar19;
  }
  dVar19 = yref * 0.01745329252;
  dVar8 = cos(dVar19);
  dVar9 = sin(dVar19);
  if (*type != '-') goto switchD_0020264e_caseD_4f;
  __x = xref * 0.01745329252;
  local_d8 = local_d8 * 0.01745329252;
  dStack_d0 = dStack_d0 * 0.01745329252;
  dVar17 = dStack_d0 * dStack_d0 + local_d8 * local_d8;
  bVar1 = type[1];
  if (0x4c < bVar1) {
    switch(bVar1) {
    case 0x4d:
      if ((type[2] != 'E') || (type[3] != 'R')) break;
      dVar6 = yinc * dVar6 + dVar7 * xinc;
      uVar5 = -(ulong)(dVar6 == 0.0);
      dVar6 = (double)(uVar5 & 0x3ff0000000000000 | ~uVar5 & (ulong)dVar6);
      dVar7 = (yref * 0.5 + 45.0) * 0.01745329252;
      dVar8 = tan(dVar7);
      dVar8 = log(dVar8);
      dVar7 = tan(dVar6 * 0.5 * 0.01745329252 + dVar7);
      dVar7 = log(dVar7);
      dVar19 = cos(dVar19);
      dVar16 = dStack_d0 /
               (double)(~-(ulong)(0.0 < dVar19) & 0x3ff0000000000000 |
                       (ulong)dVar19 & -(ulong)(0.0 < dVar19)) + __x;
      if (6.28318530717959 < ABS(dVar16 - __x)) goto LAB_002034e7;
      dVar6 = (dVar6 * 0.01745329252) / (dVar7 - dVar8);
      dVar6 = exp((double)(-(ulong)(dVar6 != 0.0) & (ulong)((dVar8 * dVar6 + local_d8) / dVar6)));
      dVar6 = atan(dVar6);
      local_f8 = dVar6 + dVar6 + -1.5707963267948974;
      goto LAB_0020338c;
    case 0x4e:
      if ((type[2] == 'C') && (type[3] == 'P')) {
        dVar8 = dVar8 - dVar9 * local_d8;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar16 = atan2(dStack_d0,dVar8);
          dVar16 = dVar16 + __x;
          dVar6 = cos(dVar16 - __x);
          if (((dVar6 != 0.0) || (NAN(dVar6))) && (ABS(dVar8 / dVar6) <= 1.0)) {
            local_f8 = acos(dVar8 / dVar6);
            if (dVar19 < 0.0) {
              local_f8 = -local_f8;
            }
            goto LAB_0020338c;
          }
        }
        goto LAB_002034e7;
      }
      break;
    case 0x53:
      if (type[2] == 'T') {
        if (type[3] != 'G') break;
        dVar6 = (4.0 - dVar17) / (dVar17 + 4.0);
        if (1.0 < ABS(dVar6)) goto LAB_002034e7;
        dVar7 = dVar6 * dVar9 + local_d8 * dVar8 * (dVar6 + 1.0) * 0.5;
        if (1.0 < ABS(dVar7)) goto LAB_002034e7;
        local_f8 = asin(dVar7);
        dVar7 = cos(local_f8);
        if ((ABS(dVar7) < 1e-05) ||
           (dVar6 = ((dVar6 + 1.0) * dStack_d0) / (dVar7 + dVar7), 1.0 < ABS(dVar6)))
        goto LAB_002034e7;
        dVar6 = asin(dVar6);
        dVar7 = sin(local_f8);
        dVar19 = cos(local_f8);
        dVar17 = cos(dVar6);
        dVar7 = dVar17 * dVar19 * dVar8 + dVar7 * dVar9 + 1.0;
        if (ABS(dVar7) < 1e-05) goto LAB_002034e7;
        dVar19 = sin(local_f8);
        dVar17 = cos(local_f8);
        dVar16 = cos(dVar6);
        dVar19 = dVar19 * dVar8 - dVar9 * dVar17 * dVar16;
        uVar5 = -(ulong)(1e-05 < ABS((dVar19 + dVar19) / dVar7 - local_d8));
        dVar16 = (double)(~uVar5 & (ulong)dVar6 | (ulong)(3.141592653589795 - dVar6) & uVar5);
LAB_00203364:
        dVar16 = dVar16 + __x;
        goto LAB_0020338c;
      }
      if ((type[2] != 'I') || (type[3] != 'N')) break;
      if (1.0 < dVar17) {
LAB_002034e7:
        *status = 0x1f5;
        return 0x1f5;
      }
      dVar17 = 1.0 - dVar17;
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      dVar6 = dVar9 * dVar17 + local_d8 * dVar8;
      if (1.0 < ABS(dVar6)) goto LAB_002034e7;
      local_f8 = asin(dVar6);
      dVar6 = dVar8 * dVar17 - dVar9 * local_d8;
      if ((((dVar6 == 0.0) && (!NAN(dVar6))) && (dStack_d0 == 0.0)) && (!NAN(dStack_d0)))
      goto LAB_002034e7;
      dStack_d0 = atan2(dStack_d0,dVar6);
      goto LAB_0020329c;
    case 0x54:
      if ((type[2] == 'A') && (type[3] == 'N')) {
        dVar6 = cos(__x);
        dVar7 = sin(__x);
        dVar19 = cos(__x);
        dVar17 = (dVar6 * dVar8 - dVar7 * dStack_d0) - dVar19 * local_d8 * dVar9;
        dVar6 = sin(__x);
        dVar7 = cos(__x);
        dVar19 = sin(__x);
        dVar6 = (dVar6 * dVar8 + dVar7 * dStack_d0) - dVar19 * local_d8 * dVar9;
        dVar16 = atan2(dVar6,dVar17);
        local_f8 = atan((dVar8 * local_d8 + dVar9) / SQRT(dVar17 * dVar17 + dVar6 * dVar6));
        goto LAB_0020338c;
      }
    }
switchD_0020264e_caseD_4f:
    *status = 0x1f8;
    return 0x1f8;
  }
  dVar16 = __x;
  if (bVar1 == 0x41) {
    if (type[2] != 'I') {
      if ((type[2] != 'R') || (type[3] != 'C')) goto switchD_0020264e_caseD_4f;
      if (9.869604401089369 <= dVar17) goto LAB_002034e7;
      dVar17 = SQRT(dVar17);
      dVar6 = cos(dVar17);
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        dVar7 = sin(dVar17);
        dVar7 = dVar7 / dVar17;
      }
      else {
        dVar7 = 1.0;
      }
      dVar19 = local_d8 * dVar8 * dVar7 + dVar9 * dVar6;
      if (1.0 < ABS(dVar19)) goto LAB_002034e7;
      local_f8 = asin(dVar19);
      dVar6 = dVar6 - dVar9 * dVar19;
      dVar8 = dVar8 * dVar7 * dStack_d0;
      if ((((dVar6 == 0.0) && (!NAN(dVar6))) && (dVar8 == 0.0)) && (!NAN(dVar8))) goto LAB_002034e7;
      dVar16 = atan2(dVar8,dVar6);
      goto LAB_00203364;
    }
    if (type[3] != 'T') goto switchD_0020264e_caseD_4f;
    dVar8 = yinc * dVar6 + dVar7 * xinc;
    uVar5 = -(ulong)(dVar8 == 0.0);
    dVar8 = (double)(uVar5 & 0x3f91df46a252dd11 | ~uVar5 & (ulong)(dVar8 * 0.01745329252));
    dVar9 = dVar19 + dVar8;
    dVar17 = sin(dVar9);
    dVar9 = cos(dVar9);
    dVar9 = (dVar9 + 1.0) * 0.5;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar10 = sin(dVar19);
    dVar11 = cos(dVar19);
    dVar11 = (dVar11 + 1.0) * 0.5;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar6 = xinc * dVar6 - dVar7 * yinc;
    uVar5 = -(ulong)(dVar6 == 0.0);
    dVar6 = (double)(uVar5 & 0x3f91df46a252dd11 | ~uVar5 & (ulong)(dVar6 * 0.01745329252));
    dVar7 = cos(dVar19);
    dVar12 = dVar6 * 0.5;
    dVar13 = sin(dVar12);
    dVar14 = cos(dVar19);
    dVar12 = cos(dVar12);
    dVar12 = (dVar12 * dVar14 + 1.0) * 0.5;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar14 = sin(dVar19);
    dVar15 = cos(dVar19);
    dVar15 = (dVar15 + 1.0) * 0.5;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
      uVar2 = extraout_EAX_00;
    }
    else {
      dVar15 = SQRT(dVar15);
      uVar2 = extraout_EAX;
    }
    auVar21._8_8_ = -(ulong)(dStack_d0 != 0.0);
    auVar21._0_8_ = -(ulong)(local_d8 != 0.0);
    iVar3 = movmskpd(uVar2,auVar21);
    local_f8 = dVar19;
    if (iVar3 == 0) goto LAB_0020338c;
    auVar20._8_8_ = dVar10;
    auVar20._0_8_ = dVar17;
    auVar18._8_8_ = dVar11;
    auVar18._0_8_ = dVar9;
    auVar21 = divpd(auVar20,auVar18);
    dVar13 = (dVar7 + dVar7) * dVar13;
    dVar7 = auVar21._0_8_ - auVar21._8_8_;
    uVar5 = -(ulong)(dVar13 == 0.0);
    uVar4 = -(ulong)(dVar7 == 0.0);
    dVar8 = dVar8 / (double)(uVar4 & 0x3ff0000000000000 | ~uVar4 & (ulong)dVar7);
    dVar7 = (dVar6 * dVar12) / (double)(uVar5 & 0x3ff0000000000000 | ~uVar5 & (ulong)dVar13);
    local_d8 = (dVar14 * dVar8) / dVar15 + local_d8;
    dVar6 = local_d8 / dVar8;
    dVar6 = (4.0 - (dStack_d0 * dStack_d0) / (dVar7 * 4.0 * dVar7)) - dVar6 * dVar6;
    if ((4.0 < dVar6) || (dVar6 < 2.0)) goto LAB_002034e7;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar8 = (local_d8 * dVar6 * 0.5) / dVar8;
    if (1.0 < ABS(dVar8)) goto LAB_002034e7;
    local_f8 = asin(dVar8);
    dVar19 = cos(local_f8);
    if (ABS(dVar19) < 1e-05) goto LAB_002034e7;
    dVar19 = cos(local_f8);
    dVar6 = (dVar6 * 0.5 * dStack_d0) / (dVar19 * (dVar7 + dVar7));
    if (1.0 < ABS(dVar6)) goto LAB_002034e7;
    dStack_d0 = asin(dVar6);
    dStack_d0 = dStack_d0 + dStack_d0;
  }
  else {
    if (bVar1 == 0x43) {
      if ((type[2] == 'A') && (type[3] == 'R')) {
        local_f8 = dVar19 + local_d8;
        dVar16 = __x + dStack_d0;
        goto LAB_0020338c;
      }
      goto switchD_0020264e_caseD_4f;
    }
    if (((bVar1 != 0x47) || (type[2] != 'L')) || (type[3] != 'S')) goto switchD_0020264e_caseD_4f;
    local_f8 = dVar19 + local_d8;
    if ((1.5707963267948974 < ABS(local_f8)) ||
       (dVar6 = cos(local_f8), dVar6 * 6.28318530717959 * 0.5 < ABS(dStack_d0))) goto LAB_002034e7;
    if (dVar6 <= 1e-05) goto LAB_0020338c;
    dStack_d0 = dStack_d0 / dVar6;
  }
LAB_0020329c:
  dVar16 = dStack_d0 + __x;
LAB_0020338c:
  uVar5 = -(ulong)(3.141592653589795 < dVar16 - __x);
  dVar6 = (double)(~uVar5 & (ulong)dVar16 | (ulong)(dVar16 + -6.28318530717959) & uVar5);
  uVar5 = -(ulong)(dVar6 - __x < -3.141592653589795);
  dVar6 = (double)(~uVar5 & (ulong)dVar6 | (ulong)(dVar6 + 6.28318530717959) & uVar5);
  *xpos = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                  (ulong)(dVar6 + 6.28318530717959) & -(ulong)(dVar6 < 0.0)) / 0.01745329252;
  *ypos = local_f8 / 0.01745329252;
  return *status;
}

Assistant:

int ffwldp(double xpix, double ypix, double xref, double yref,
      double xrefpix, double yrefpix, double xinc, double yinc, double rot,
      char *type, double *xpos, double *ypos, int *status)

/* This routine is based on the classic AIPS WCS routine. 

   It converts from pixel location to RA,Dec for 9 projective geometries:
   "-CAR", "-SIN", "-TAN", "-ARC", "-NCP", "-GLS", "-MER", "-AIT" and "-STG".
*/

/*-----------------------------------------------------------------------*/
/* routine to determine accurate position for pixel coordinates          */
/* returns 0 if successful otherwise:                                    */
/* 501 = angle too large for projection;                                 */
/* does: -CAR, -SIN, -TAN, -ARC, -NCP, -GLS, -MER, -AIT  -STG projections*/
/* Input:                                                                */
/*   f   xpix    x pixel number  (RA or long without rotation)           */
/*   f   ypiy    y pixel number  (dec or lat without rotation)           */
/*   d   xref    x reference coordinate value (deg)                      */
/*   d   yref    y reference coordinate value (deg)                      */
/*   f   xrefpix x reference pixel                                       */
/*   f   yrefpix y reference pixel                                       */
/*   f   xinc    x coordinate increment (deg)                            */
/*   f   yinc    y coordinate increment (deg)                            */
/*   f   rot     rotation (deg)  (from N through E)                      */
/*   c  *type    projection type code e.g. "-SIN";                       */
/* Output:                                                               */
/*   d   *xpos   x (RA) coordinate (deg)                                 */
/*   d   *ypos   y (dec) coordinate (deg)                                */
/*-----------------------------------------------------------------------*/
 {double cosr, sinr, dx, dy, dz, temp, x, y, z;
  double sins, coss, dect, rat, dt, l, m, mg, da, dd, cos0, sin0;
  double dec0, ra0;
  double geo1, geo2, geo3;
  double deps = 1.0e-5;
  char *cptr;
  
  if (*status > 0)
     return(*status);

/*   Offset from ref pixel  */
  dx = (xpix-xrefpix) * xinc;
  dy = (ypix-yrefpix) * yinc;

/*   Take out rotation  */
  cosr = cos(rot * D2R);
  sinr = sin(rot * D2R);
  if (rot != 0.0) {
     temp = dx * cosr - dy * sinr;
     dy = dy * cosr + dx * sinr;
     dx = temp;
  }

/* convert to radians  */
  ra0 = xref * D2R;
  dec0 = yref * D2R;

  l = dx * D2R;
  m = dy * D2R;
  sins = l*l + m*m;
  cos0 = cos(dec0);
  sin0 = sin(dec0);

  if (*type != '-') {  /* unrecognized projection code */
     return(*status = 504);
  }

    cptr = type + 1;

    if (*cptr == 'C') { /* linear -CAR */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      rat =  ra0 + l;
      dect = dec0 + m;

    } else if (*cptr == 'T') {  /* -TAN */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'N') {
         return(*status = 504);
      }
      x = cos0*cos(ra0) - l*sin(ra0) - m*cos(ra0)*sin0;
      y = cos0*sin(ra0) + l*cos(ra0) - m*sin(ra0)*sin0;
      z = sin0                       + m*         cos0;
      rat  = atan2( y, x );
      dect = atan ( z / sqrt(x*x+y*y) );

    } else if (*cptr == 'S') {

      if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'N') { /* -SIN */
          if (sins>1.0)
	    return(*status = 501);
          coss = sqrt (1.0 - sins);
          dt = sin0 * coss + cos0 * m;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          rat = cos0 * coss - sin0 * m;
          if ((rat==0.0) && (l==0.0))
	    return(*status = 501);
          rat = atan2 (l, rat) + ra0;

       } else if (*(cptr + 1) == 'T' &&  *(cptr + 2) == 'G') {  /* -STG Sterographic*/
          dz = (4.0 - sins) / (4.0 + sins);
          if (fabs(dz)>1.0)
	    return(*status = 501);
          dect = dz * sin0 + m * cos0 * (1.0+dz) / 2.0;
          if (fabs(dect)>1.0)
	    return(*status = 501);
          dect = asin (dect);
          rat = cos(dect);
          if (fabs(rat)<deps)
	    return(*status = 501);
          rat = l * (1.0+dz) / (2.0 * rat);
          if (fabs(rat)>1.0)
	    return(*status = 501);
          rat = asin (rat);
          mg = 1.0 + sin(dect) * sin0 + cos(dect) * cos0 * cos(rat);
          if (fabs(mg)<deps)
	    return(*status = 501);
          mg = 2.0 * (sin(dect) * cos0 - cos(dect) * sin0 * cos(rat)) / mg;
          if (fabs(mg-m)>deps)
	    rat = TWOPI /2.0 - rat;
          rat = ra0 + rat;
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'A') {

      if (*(cptr + 1) == 'R' &&  *(cptr + 2) == 'C') { /* ARC */
          if (sins>=TWOPI*TWOPI/4.0)
	    return(*status = 501);
          sins = sqrt(sins);
          coss = cos (sins);
          if (sins!=0.0)
	    sins = sin (sins) / sins;
          else
	    sins = 1.0;
          dt = m * cos0 * sins + sin0 * coss;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          da = coss - dt * sin0;
          dt = l * sins * cos0;
          if ((da==0.0) && (dt==0.0))
	    return(*status = 501);
          rat = ra0 + atan2 (dt, da);

      } else if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'T') {  /* -AIT Aitoff */
          dt = yinc*cosr + xinc*sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dy = yref * D2R;
          dx = sin(dy+dt)/sqrt((1.0+cos(dy+dt))/2.0) -
	      sin(dy)/sqrt((1.0+cos(dy))/2.0);
          if (dx==0.0)
	    dx = 1.0;
          geo2 = dt / dx;
          dt = xinc*cosr - yinc* sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dx = 2.0 * cos(dy) * sin(dt/2.0);
          if (dx==0.0) dx = 1.0;
          geo1 = dt * sqrt((1.0+cos(dy)*cos(dt/2.0))/2.0) / dx;
          geo3 = geo2 * sin(dy) / sqrt((1.0+cos(dy))/2.0);
          rat = ra0;
          dect = dec0;
          if ((l != 0.0) || (m != 0.0)) {
            dz = 4.0 - l*l/(4.0*geo1*geo1) - ((m+geo3)/geo2)*((m+geo3)/geo2) ;
            if ((dz>4.0) || (dz<2.0)) return(*status = 501);
            dz = 0.5 * sqrt (dz);
            dd = (m+geo3) * dz / geo2;
            if (fabs(dd)>1.0) return(*status = 501);
            dd = asin (dd);
            if (fabs(cos(dd))<deps) return(*status = 501);
            da = l * dz / (2.0 * geo1 * cos(dd));
            if (fabs(da)>1.0) return(*status = 501);
            da = asin (da);
            rat = ra0 + 2.0 * da;
            dect = dd;
          }
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'N') { /* -NCP North celestial pole*/
      if (*(cptr + 1) != 'C' ||  *(cptr + 2) != 'P') {
         return(*status = 504);
      }
      dect = cos0 - m * sin0;
      if (dect==0.0)
        return(*status = 501);
      rat = ra0 + atan2 (l, dect);
      dt = cos (rat-ra0);
      if (dt==0.0)
        return(*status = 501);
      dect = dect / dt;
      if ((dect>1.0) || (dect<-1.0))
        return(*status = 501);
      dect = acos (dect);
      if (dec0<0.0) dect = -dect;

    } else if (*cptr == 'G') {   /* -GLS global sinusoid */
      if (*(cptr + 1) != 'L' ||  *(cptr + 2) != 'S') {
         return(*status = 504);
      }
      dect = dec0 + m;
      if (fabs(dect)>TWOPI/4.0)
        return(*status = 501);
      coss = cos (dect);
      if (fabs(l)>TWOPI*coss/2.0)
        return(*status = 501);
      rat = ra0;
      if (coss>deps) rat = rat + l / coss;

    } else if (*cptr == 'M') {  /* -MER mercator*/
      if (*(cptr + 1) != 'E' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      dt = yinc * cosr + xinc * sinr;
      if (dt==0.0) dt = 1.0;
      dy = (yref/2.0 + 45.0) * D2R;
      dx = dy + dt / 2.0 * D2R;
      dy = log (tan (dy));
      dx = log (tan (dx));
      geo2 = dt * D2R / (dx - dy);
      geo3 = geo2 * dy;
      geo1 = cos (yref*D2R);
      if (geo1<=0.0) geo1 = 1.0;
      rat = l / geo1 + ra0;
      if (fabs(rat - ra0) > TWOPI)
        return(*status = 501);
      dt = 0.0;
      if (geo2!=0.0) dt = (m + geo3) / geo2;
      dt = exp (dt);
      dect = 2.0 * atan (dt) - TWOPI / 4.0;

    } else  {
      return(*status = 504);
    }

  /*  correct for RA rollover  */
  if (rat-ra0>TWOPI/2.0) rat = rat - TWOPI;
  if (rat-ra0<-TWOPI/2.0) rat = rat + TWOPI;
  if (rat < 0.0) rat += TWOPI;

  /*  convert to degrees  */
  *xpos  = rat  / D2R;
  *ypos  = dect  / D2R;
  return(*status);
}